

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

PropertyQueryFlags __thiscall Js::JavascriptProxy::HasItemQuery(JavascriptProxy *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  PropertyId propertyId;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  int iVar6;
  HostScriptContext *pHVar7;
  RecyclableObject *pRVar8;
  JavascriptFunction *function;
  PropertyRecord *local_78;
  PropertyRecord *propertyRecord;
  Type local_68;
  Type local_60;
  Type local_58;
  Var local_50;
  ScriptContext *local_40;
  RecyclableObject *local_38;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return Property_NotFound;
  }
  local_40 = (ScriptContext *)CONCAT44(local_40._4_4_,index);
  pHVar7 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar7->scriptContext;
  pRVar8 = MarshalHandler(this,pSVar2);
  if (pRVar8 == (RecyclableObject *)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar3) {
      return Property_NotFound;
    }
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"has");
  }
  local_38 = MarshalTarget(this,pSVar2);
  function = GetMethodHelper(this,0xb4,pSVar2);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar2), bVar3)) {
    BVar5 = JavascriptOperators::HasItem(local_38,(uint32)local_40);
    return (uint)(BVar5 != 0);
  }
  PropertyIdFromInt(this,(uint32)local_40,&local_78);
  propertyId = local_78->pid;
  local_40 = pSVar2;
  local_50 = GetName(pSVar2,propertyId);
  local_58.ptr = local_38;
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  propertyRecord = (PropertyRecord *)this_00;
  local_68.ptr = function;
  local_60.ptr = pRVar8;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar4) {
    pRVar8 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()
                       ((anon_class_40_5_39f35981 *)&propertyRecord);
    bVar4 = ThreadContext::IsOnStack(pRVar8);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba6444;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar8 = (RecyclableObject *)
               anon_func::anon_class_40_5_39f35981::operator()
                         ((anon_class_40_5_39f35981 *)&propertyRecord);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ba6444;
    }
    pRVar8 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()
                       ((anon_class_40_5_39f35981 *)&propertyRecord);
    bVar4 = ThreadContext::IsOnStack(pRVar8);
  }
  if (bVar4 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba6444:
  pSVar2 = local_40;
  this_00->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(pRVar8,local_40);
  if (BVar5 != 0) {
    return Property_Found;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
  BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                    (local_38,propertyId,pSVar2,(PropertyDescriptor *)&propertyRecord);
  if ((BVar5 != 0) &&
     ((bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&propertyRecord), !bVar3 ||
      (iVar6 = (*(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x33])(), iVar6 == 0)))) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"has");
  }
  return Property_NotFound;
}

Assistant:

PropertyQueryFlags JavascriptProxy::HasItemQuery(uint32 index)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::HasItem(object, index);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        return JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyId));
    }